

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall
TEST_PlayerHandTest_Triplet_TestShell::~TEST_PlayerHandTest_Triplet_TestShell
          (TEST_PlayerHandTest_Triplet_TestShell *this)

{
  TEST_PlayerHandTest_Triplet_TestShell *mem;
  TEST_PlayerHandTest_Triplet_TestShell *this_local;
  
  mem = this;
  ~TEST_PlayerHandTest_Triplet_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(PlayerHandTest, Triplet)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindTriplet({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}